

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ostream_logger.cpp
# Opt level: O1

Logger * __thiscall util::logging::Ostream_logger::do_output(Ostream_logger *this,Msg *msg)

{
  uint_least32_t uVar1;
  sp_counted_base *psVar2;
  element_type *peVar3;
  char cVar4;
  M_Level MVar5;
  uint_least32_t uVar6;
  char *__function;
  bool bVar7;
  undefined1 *local_50;
  string fmtmsg;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> tout;
  
  MVar5 = Msg::getMsg_lvl(msg);
  if ((((MVar5 & (this->super_Logger).verb_lvl) == 0) ||
      (psVar2 = (this->outstream).pn.pi_, psVar2 == (sp_counted_base *)0x0)) ||
     (psVar2->use_count_ == 0)) {
    return &this->super_Logger;
  }
  fmtmsg.field_2._8_8_ = 0;
  tout.px = (element_type *)(this->outstream).pn.pi_;
  if ((sp_counted_base *)tout.px != (sp_counted_base *)0x0) {
    uVar6 = ((sp_counted_base *)tout.px)->use_count_;
    do {
      if (uVar6 == 0) {
        uVar6 = 0;
        break;
      }
      LOCK();
      uVar1 = ((sp_counted_base *)tout.px)->use_count_;
      bVar7 = uVar6 == uVar1;
      if (bVar7) {
        ((sp_counted_base *)tout.px)->use_count_ = uVar6 + 1;
        uVar1 = uVar6;
      }
      uVar6 = uVar1;
      UNLOCK();
    } while (!bVar7);
    if (uVar6 == 0) {
      tout.px = (element_type *)0x0;
    }
  }
  if (tout.px != (element_type *)0x0) {
    fmtmsg.field_2._8_8_ = (this->outstream).px;
  }
  peVar3 = (this->super_Logger).formatter.px;
  if (peVar3 == (element_type *)0x0) {
    __function = 
    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<util::logging::Formatter>::operator->() const [T = util::logging::Formatter]"
    ;
  }
  else {
    (*peVar3->_vptr_Formatter[2])(&local_50,peVar3,msg);
    if (fmtmsg.field_2._8_8_ != 0) {
      std::ostream::write((char *)fmtmsg.field_2._8_8_,(long)local_50);
      if (fmtmsg.field_2._8_8_ != 0) {
        cVar4 = (char)fmtmsg.field_2._8_8_;
        std::ios::widen((char)*(undefined8 *)(*(long *)fmtmsg.field_2._8_8_ + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        if ((size_type *)local_50 != &fmtmsg._M_string_length) {
          operator_delete(local_50);
        }
        boost::detail::shared_count::~shared_count((shared_count *)&tout);
        return &this->super_Logger;
      }
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,
                    "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<std::basic_ostream<char>>::operator*() const [T = std::basic_ostream<char>]"
                   );
    }
    __function = 
    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<std::basic_ostream<char>>::operator->() const [T = std::basic_ostream<char>]"
    ;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,__function);
}

Assistant:

Logger& Ostream_logger::do_output( const Msg& msg )
		{
			if((msg.getMsg_lvl() & verb_lvl) != 0 and (not outstream.expired()))
			{
				shared_ptr<std::ostream> tout = outstream.lock();

				std::string fmtmsg = formatter->do_formatting(msg);
				tout->write(fmtmsg.c_str(), fmtmsg.size());
				std::endl(*tout);
			}

			return *this;

		}